

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-list.c
# Opt level: O0

uint8_t object_list_entry_line_attribute(object_list_entry_t *entry)

{
  object *obj;
  _Bool _Var1;
  object *base_obj;
  uint8_t attr;
  object_list_entry_t *entry_local;
  
  if (((entry == (object_list_entry_t *)0x0) || (entry->object == (object *)0x0)) ||
     (entry->object->kind == (object_kind *)0x0)) {
    entry_local._7_1_ = '\x01';
  }
  else {
    obj = cave->objects[entry->object->oidx];
    _Var1 = is_unknown(obj);
    if (_Var1) {
      base_obj._7_1_ = '\x04';
    }
    else if (obj->known->artifact == (artifact *)0x0) {
      _Var1 = object_flavor_is_aware(obj);
      if (_Var1) {
        if (obj->kind->cost == 0) {
          base_obj._7_1_ = '\x02';
        }
        else {
          base_obj._7_1_ = '\x01';
        }
      }
      else {
        base_obj._7_1_ = '\f';
      }
    }
    else {
      base_obj._7_1_ = '\x11';
    }
    entry_local._7_1_ = base_obj._7_1_;
  }
  return entry_local._7_1_;
}

Assistant:

uint8_t object_list_entry_line_attribute(const object_list_entry_t *entry)
{
	uint8_t attr;
	struct object *base_obj;

	if (entry == NULL || entry->object == NULL || entry->object->kind == NULL)
		return COLOUR_WHITE;

	base_obj = cave->objects[entry->object->oidx];

	if (is_unknown(base_obj))
		/* unknown object */
		attr = COLOUR_RED;
	else if (base_obj->known->artifact)
		/* known artifact */
		attr = COLOUR_VIOLET;
	else if (!object_flavor_is_aware(base_obj))
		/* unaware of kind */
		attr = COLOUR_L_RED;
	else if (base_obj->kind->cost == 0)
		/* worthless */
		attr = COLOUR_SLATE;
	else
		/* default */
		attr = COLOUR_WHITE;

	return attr;
}